

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O0

void __thiscall psy::C::NameCatalog::catalogUse_CORE<1ul,0ul>(NameCatalog *this,string *name)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>,_unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>_>_>
  *p_Var2;
  Enclosure *__x;
  bool bVar3;
  unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>
  *this_00;
  pointer ppVar4;
  pair<bool,_unsigned_long> pVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
  local_b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
  local_a8;
  iterator iter;
  __tuple_element_t<0UL,_tuple<unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>,_unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>_>_>
  *otherUseAndDef;
  bool local_71;
  pair<bool,_unsigned_long> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>
  local_60;
  unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>
  *local_30;
  __tuple_element_t<1UL,_tuple<unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>,_unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>_>_>
  *useAndDef;
  size_type curDepth;
  Enclosure *enclosure;
  string *name_local;
  NameCatalog *this_local;
  
  enclosure = (Enclosure *)name;
  name_local = (string *)this;
  curDepth = (size_type)currentEnclosure_abi_cxx11_(this);
  useAndDef = (__tuple_element_t<1UL,_tuple<unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>,_unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>_>_>
               *)std::
                 stack<const_psy::C::SyntaxNode_*,_std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>_>
                 ::size(&this->enclosureStack_);
  this_00 = (unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>
             *)std::
               get<1ul,std::unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>,std::unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>>
                         ((tuple<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>_>
                           *)curDepth);
  __x = enclosure;
  local_71 = false;
  local_30 = this_00;
  pVar5 = std::make_pair<bool,unsigned_long&>(&local_71,(unsigned_long *)&useAndDef);
  local_70.second = pVar5.second;
  local_70.first = pVar5.first;
  std::make_pair<std::__cxx11::string_const&,std::pair<bool,unsigned_long>>
            (&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
             &local_70);
  std::
  unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>
  ::insert<std::pair<std::__cxx11::string,std::pair<bool,unsigned_long>>>(this_00,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>
  ::~pair(&local_60);
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
             )std::
              get<0ul,std::unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>,std::unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>>
                        ((tuple<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>_>
                          *)curDepth);
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
               *)iter.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
                 ._M_cur,(key_type *)enclosure);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
       ::end(iter.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
             ._M_cur);
  bVar3 = std::__detail::operator!=(&local_a8,&local_b0);
  p_Var2 = useAndDef;
  bVar1 = false;
  if (bVar3) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_false,_true>
                           *)&local_a8);
    bVar1 = (__tuple_element_t<1UL,_tuple<unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>,_unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>_>_>
             *)(ppVar4->second).second < p_Var2;
  }
  if (bVar1) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
    ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
             *)iter.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
               ._M_cur,(iterator)local_a8._M_cur);
  }
  return;
}

Assistant:

void NameCatalog::catalogUse_CORE(const std::string& name)
{
    auto enclosure = currentEnclosure();
    auto curDepth = enclosureStack_.size();
    auto& useAndDef = std::get<UseAndDef>(*enclosure);
    useAndDef.insert(std::make_pair(name, std::make_pair(false, curDepth)));
    auto& otherUseAndDef = std::get<OtherUseAndDef>(*enclosure);
    auto iter = otherUseAndDef.find(name);
    if (iter != otherUseAndDef.end() && curDepth > iter->second.second)
        otherUseAndDef.erase(iter);
}